

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O3

void __thiscall
test::test_load_and_export_public_key::test_method(test_load_and_export_public_key *this)

{
  int iVar1;
  initializer_list<unsigned_char> __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_pubkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_exported;
  string pk_str;
  long *local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  undefined1 local_160;
  undefined8 local_158;
  shared_count sStack_150;
  void *local_148;
  long local_140;
  undefined **local_130;
  undefined1 local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [128];
  
  license::CryptoHelper::getInstance();
  memcpy(local_b0,&DAT_00420415,0x8c);
  __l._M_len = 0x8c;
  __l._M_array = (iterator)local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_178,__l,(allocator_type *)&local_130);
  loadPrivateKey_abi_cxx11_();
  (**(code **)(*local_180 + 0x20))(local_180,local_b0);
  (**(code **)(*local_180 + 0x10))(&local_148);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x5a);
  local_160 = (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start == local_140 - (long)local_148;
  local_158 = 0;
  sStack_150.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00542df0;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = "exported key and expected are the same size";
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_150);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x5c);
  if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_160 = true;
  }
  else {
    iVar1 = bcmp(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,local_148,
                 (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_160 = iVar1 == 0;
  }
  local_158 = 0;
  sStack_150.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00542e30;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = "exported key and expected have the same content";
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_108 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_150);
  if (local_148 != (void *)0x0) {
    operator_delete(local_148);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_load_and_export_public_key) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	const vector<unsigned char> expected_pubkey(PUBKEY);
	const std::string pk_str = loadPrivateKey();
	crypto->loadPrivateKey(pk_str);
	vector<unsigned char> pk_exported = crypto->exportPublicKey();

	/*
	 for (auto it : pk_exported) {
	 cout << ((int)it) << ",";
	 }
	 ofstream myfile("public_key.rsa");
	 for (auto it : pk_exported) {
	 myfile << it;
	 }
	 myfile.close();*/
	BOOST_CHECK_MESSAGE(expected_pubkey.size() == pk_exported.size(), "exported key and expected are the same size");
	BOOST_CHECK_MESSAGE(std::equal(expected_pubkey.begin(), expected_pubkey.end(), pk_exported.begin()),
						"exported key and expected have the same content");
	crypto.release();
}